

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

void init_combine(gen_ctx_t gen_ctx)

{
  combine_ctx *pcVar1;
  bitmap_t pVVar2;
  gen_ctx_t gen_ctx_local;
  
  pcVar1 = (combine_ctx *)gen_malloc(gen_ctx,0x50);
  gen_ctx->combine_ctx = pcVar1;
  gen_ctx->combine_ctx->curr_bb_var_ref_age = 0;
  VARR_size_tcreate(&gen_ctx->combine_ctx->var_ref_ages,0);
  VARR_var_ref_tcreate(&gen_ctx->combine_ctx->var_refs,0);
  VARR_MIR_reg_tcreate(&gen_ctx->combine_ctx->insn_vars,0);
  VARR_size_tcreate(&gen_ctx->combine_ctx->changed_op_numbers,0x10);
  VARR_MIR_op_tcreate(&gen_ctx->combine_ctx->last_right_ops,0x10);
  pVVar2 = bitmap_create();
  gen_ctx->combine_ctx->vars_bitmap = pVVar2;
  return;
}

Assistant:

static void init_combine (gen_ctx_t gen_ctx) {
  gen_ctx->combine_ctx = gen_malloc (gen_ctx, sizeof (struct combine_ctx));
  curr_bb_var_ref_age = 0;
  VARR_CREATE (size_t, var_ref_ages, 0);
  VARR_CREATE (var_ref_t, var_refs, 0);
  VARR_CREATE (MIR_reg_t, insn_vars, 0);
  VARR_CREATE (size_t, changed_op_numbers, 16);
  VARR_CREATE (MIR_op_t, last_right_ops, 16);
  vars_bitmap = bitmap_create ();
}